

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variant.hh
# Opt level: O0

void __thiscall
Variant<int,std::__cxx11::string,char_const*>::move0<char_const*>
          (Variant<int,std::__cxx11::string,char_const*> *this,type_index *old_t,void *old_v,
          void *new_v)

{
  bool bVar1;
  type_index local_30;
  undefined8 *local_28;
  void *new_v_local;
  void *old_v_local;
  type_index *old_t_local;
  Variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
  *this_local;
  
  local_28 = (undefined8 *)new_v;
  new_v_local = old_v;
  old_v_local = old_t;
  old_t_local = (type_index *)this;
  std::type_index::type_index(&local_30,(type_info *)&char_const*::typeinfo);
  bVar1 = std::type_index::operator==(old_t,&local_30);
  if (bVar1) {
    *local_28 = *new_v_local;
  }
  return;
}

Assistant:

void move0(const std::type_index& old_t, void *old_v, void *new_v)
	{
		if (old_t == std::type_index(typeid(T)))
			new (new_v)T(std::move(*reinterpret_cast<T*>(old_v)));
	}